

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O3

cmd_ln_val_t * cmd_ln_val_init(int t,char *name,char *str)

{
  byte bVar1;
  byte *ptr;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  cmd_ln_val_t *pcVar5;
  size_t sVar6;
  byte *pbVar7;
  uint uVar8;
  ulong uVar9;
  size_t alloced;
  char *resolved_str;
  anytype_t val;
  size_t local_b8;
  char *local_b0;
  ulong local_a8;
  byte *local_a0;
  char *local_98 [13];
  
  if (str == (char *)0x0) {
    local_98[0] = (char *)0x0;
    goto LAB_001228d1;
  }
  local_a0 = (byte *)0x0;
  local_b8 = 0;
  local_a8 = (ulong)(uint)t;
  pcVar3 = strstr(str,"$(");
  local_b0 = str;
  if (pcVar3 != (char *)0x0) {
    pcVar4 = str;
    do {
      if ((long)pcVar3 - (long)pcVar4 != 0) {
        strnappend((char **)&local_a0,&local_b8,pcVar4,(long)pcVar3 - (long)pcVar4);
        pcVar4 = pcVar3;
      }
      str = pcVar4 + 2;
      pcVar3 = strchr(str,0x29);
      if (pcVar3 == (char *)0x0) {
        strnappend((char **)&local_a0,&local_b8,pcVar4,2);
      }
      else {
        sVar6 = (long)pcVar3 - (long)str;
        if ((long)sVar6 < 100) {
          strncpy((char *)local_98,str,sVar6);
          *(undefined1 *)((long)local_98 + sVar6) = 0;
          pcVar4 = getenv((char *)local_98);
          if (pcVar4 != (char *)0x0) {
            strnappend((char **)&local_a0,&local_b8,pcVar4,0);
          }
        }
        str = pcVar3 + 1;
      }
      pcVar3 = strstr(str,"$(");
      pcVar4 = str;
    } while (pcVar3 != (char *)0x0);
  }
  strnappend((char **)&local_a0,&local_b8,str,0);
  ptr = local_a0;
  t = (int)local_a8;
  switch(t) {
  case 2:
  case 3:
    iVar2 = __isoc99_sscanf(local_a0,"%ld",local_98);
    ckd_free(ptr);
    if (iVar2 != 1) {
      return (cmd_ln_val_t *)0x0;
    }
    goto LAB_001228d1;
  case 4:
  case 5:
    if ((local_a0 == (byte *)0x0) || (*local_a0 == 0)) {
      atof_c((char *)local_a0);
      goto LAB_00122806;
    }
    local_98[0] = (char *)atof_c((char *)local_a0);
    break;
  case 8:
  case 9:
    local_98[0] = __ckd_salloc__((char *)local_a0,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                                 ,0x199);
    break;
  case 0x10:
  case 0x11:
    bVar1 = *local_a0;
    uVar8 = bVar1 - 0x30;
    if (uVar8 < 0x3f) {
      if ((0x4040000040400001U >> ((ulong)uVar8 & 0x3f) & 1) != 0) {
        local_98[0] = (char *)0x0;
        break;
      }
      if ((0x21000000002U >> ((ulong)uVar8 & 0x3f) & 1) == 0) goto LAB_001228b1;
    }
    else {
LAB_001228b1:
      if ((bVar1 != 0x79) && (bVar1 != 0x74)) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                ,0x193,"Unparsed boolean value \'%s\'\n",local_b0);
        goto LAB_00122806;
      }
    }
    local_98[0] = (char *)0x1;
    break;
  default:
    if (t == 0x20) {
      uVar8 = 1;
      pbVar7 = local_a0;
      do {
        if (*pbVar7 == 0x2c) {
          uVar8 = uVar8 + 1;
        }
        else if (*pbVar7 == 0) goto LAB_00122815;
        pbVar7 = pbVar7 + 1;
      } while( true );
    }
  case 6:
  case 7:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
            ,0x19f,"Unknown argument type: %d\n",local_a8 & 0xffffffff);
LAB_00122806:
    ckd_free(ptr);
    return (cmd_ln_val_t *)0x0;
  }
LAB_001228c4:
  ckd_free(ptr);
LAB_001228d1:
  pcVar5 = (cmd_ln_val_t *)
           __ckd_calloc__(1,0x18,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                          ,0x1a8);
  (pcVar5->val).ptr = local_98[0];
  pcVar5->type = t;
  pcVar3 = __ckd_salloc__(name,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                          ,0x1ab);
  pcVar5->name = pcVar3;
  return pcVar5;
LAB_00122815:
  local_98[0] = (char *)__ckd_calloc__((long)(int)(uVar8 + 1),8,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                                       ,0x161);
  if (0 < (int)uVar8) {
    uVar9 = 0;
    pbVar7 = ptr;
    do {
      for (sVar6 = 0; (pbVar7[sVar6] != 0 && (pbVar7[sVar6] != 0x2c)); sVar6 = sVar6 + 1) {
      }
      pcVar3 = (char *)__ckd_calloc__(sVar6 + 1 & 0xffffffff,1,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                                      ,0x165);
      *(char **)(local_98[0] + uVar9 * 8) = pcVar3;
      strncpy(pcVar3,(char *)pbVar7,sVar6);
      pbVar7 = pbVar7 + sVar6 + 1;
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar8);
  }
  t = (int)local_a8;
  goto LAB_001228c4;
}

Assistant:

static cmd_ln_val_t *
cmd_ln_val_init(int t, const char *name, const char *str)
{
    cmd_ln_val_t *v;
    anytype_t val;
    char *e_str;

    if (!str) {
        /* For lack of a better default value. */
        memset(&val, 0, sizeof(val));
    }
    else {
        int valid = 1;
        e_str = arg_resolve_env(str);

        switch (t) {
        case ARG_INTEGER:
        case REQARG_INTEGER:
            if (sscanf(e_str, "%ld", &val.i) != 1)
                valid = 0;
            break;
        case ARG_FLOATING:
        case REQARG_FLOATING:
            if (e_str == NULL || e_str[0] == 0)
            valid = 0;
            val.fl = atof_c(e_str);
            break;
        case ARG_BOOLEAN:
        case REQARG_BOOLEAN:
            if ((e_str[0] == 'y') || (e_str[0] == 't') ||
                (e_str[0] == 'Y') || (e_str[0] == 'T') || (e_str[0] == '1')) {
                val.i = TRUE;
            }
            else if ((e_str[0] == 'n') || (e_str[0] == 'f') ||
                     (e_str[0] == 'N') || (e_str[0] == 'F') |
                     (e_str[0] == '0')) {
                val.i = FALSE;
            }
            else {
                E_ERROR("Unparsed boolean value '%s'\n", str);
                valid = 0;
            }
            break;
        case ARG_STRING:
        case REQARG_STRING:
            val.ptr = ckd_salloc(e_str);
            break;
        case ARG_STRING_LIST:
            val.ptr = parse_string_list(e_str);
            break;
        default:
            E_ERROR("Unknown argument type: %d\n", t);
            valid = 0;
        }

        ckd_free(e_str);
        if (valid == 0)
            return NULL;
    }

    v = (cmd_ln_val_t *)ckd_calloc(1, sizeof(*v));
    memcpy(v, &val, sizeof(val));
    v->type = t;
    v->name = ckd_salloc(name);

    return v;
}